

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::anon_unknown_12::ScanLineProcess::run_decode
          (ScanLineProcess *this,exr_const_context_t ctxt,int pn,DeepFrameBuffer *outfb,int fbY,
          int fbLastY,vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *filllist)

{
  exr_decode_pipeline_t *peVar1;
  uint16_t *puVar2;
  int iVar3;
  IoExc *this_00;
  vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *filllist_00;
  uint16_t uVar4;
  
  this->last_decode_err = 0x21;
  peVar1 = &this->decoder;
  if (this->first == true) {
    iVar3 = exr_decoding_initialize(ctxt,pn,&this->cinfo,peVar1);
    if (iVar3 != 0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_00,"Unable to initialize decode pipeline");
      goto LAB_00169166;
    }
    puVar2 = &(this->decoder).decode_flags;
    *(byte *)puVar2 = (byte)*puVar2 | 3;
    this->first = false;
    uVar4 = 0;
  }
  else {
    iVar3 = exr_decoding_update(ctxt,pn,&this->cinfo,peVar1);
    if (iVar3 != 0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_00,"Unable to update decode pipeline");
      goto LAB_00169166;
    }
    uVar4 = (uint16_t)(byte)(this->decoder).decode_flags;
  }
  (this->decoder).decode_flags =
       ((this->decoder).decode_flags & 0xfffb) + (ushort)this->counts_only * 4;
  filllist_00 = (vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *)
                (ulong)(uint)fbLastY;
  update_pointers(this,outfb,fbY,fbLastY);
  if (uVar4 != (this->decoder).decode_flags) {
    iVar3 = exr_decoding_choose_default_routines(ctxt,pn,peVar1);
    if (iVar3 != 0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_00,"Unable to choose decoder routines");
      goto LAB_00169166;
    }
  }
  iVar3 = exr_decoding_run(ctxt,pn,peVar1);
  this->last_decode_err = iVar3;
  if (iVar3 == 0) {
    copy_sample_count(this,outfb,fbY);
    if (this->counts_only != false) {
      return;
    }
    run_fill(this,(DeepFrameBuffer *)(ulong)(uint)fbY,(int)filllist,filllist_00);
    return;
  }
  this_00 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::IoExc::IoExc(this_00,"Unable to run decoder");
LAB_00169166:
  __cxa_throw(this_00,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
}

Assistant:

void ScanLineProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const DeepFrameBuffer *outfb,
    int fbY,
    int fbLastY,
    const std::vector<DeepSlice> &filllist)
{
    last_decode_err = EXR_ERR_UNKNOWN;
    uint8_t flags;

    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }
        decoder.decode_flags |= EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS;
        decoder.decode_flags |= EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL;
        flags = 0;
        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
        flags = decoder.decode_flags;
    }

    if (counts_only)
        decoder.decode_flags |= EXR_DECODE_SAMPLE_DATA_ONLY;
    else
        decoder.decode_flags = decoder.decode_flags & ~EXR_DECODE_SAMPLE_DATA_ONLY;

    update_pointers (outfb, fbY, fbLastY);

    if (flags != decoder.decode_flags)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    copy_sample_count (outfb, fbY);

    if (counts_only)
        return;

    run_fill (outfb, fbY, filllist);
}